

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall
chrono::ChNodeSPH::ComputeJacobianForContactPart
          (ChNodeSPH *this,ChVector<double> *abs_point,ChMatrix33<double> *contact_plane,
          type_constraint_tuple *jacobian_tuple_N,type_constraint_tuple *jacobian_tuple_U,
          type_constraint_tuple *jacobian_tuple_V,bool second)

{
  ActualDstType actualDst;
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  ChMatrix33<double> local_88;
  ChMatrix33<double> *local_38;
  
  local_38 = contact_plane;
  ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_88,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_38);
  if (!second) {
    local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]._4_4_ =
         local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0].
         _4_4_ ^ 0x80000000;
    local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]._4_4_ =
         local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1].
         _4_4_ ^ 0x80000000;
    local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]._4_4_ =
         local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2].
         _4_4_ ^ 0x80000000;
    local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]._4_4_ =
         local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3].
         _4_4_ ^ 0x80000000;
    local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]._4_4_ =
         local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4].
         _4_4_ ^ 0x80000000;
    local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]._4_4_ =
         local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5].
         _4_4_ ^ 0x80000000;
    local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]._4_4_ =
         local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6].
         _4_4_ ^ 0x80000000;
    local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]._4_4_ =
         local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7].
         _4_4_ ^ 0x80000000;
    auVar4._0_8_ = -local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[8];
    auVar4._8_4_ = 0;
    auVar4._12_4_ = 0x80000000;
    local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         (double)vmovlps_avx(auVar4);
  }
  uVar3 = -((uint)((ulong)&jacobian_tuple_N->Cq >> 3) & 0x1fffffff) & 7;
  uVar1 = 3;
  if (uVar3 < 3) {
    uVar1 = uVar3;
  }
  if ((uVar3 == 0) || (memcpy(&jacobian_tuple_N->Cq,&local_88,(ulong)(uVar1 * 8)), uVar3 < 3)) {
    uVar2 = (ulong)(uVar1 << 3);
    memcpy((void *)((long)(jacobian_tuple_N->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar2),
           (void *)((long)local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar2),0x18 - uVar2);
  }
  uVar3 = -((uint)((ulong)&jacobian_tuple_U->Cq >> 3) & 0x1fffffff) & 7;
  uVar1 = 3;
  if (uVar3 < 3) {
    uVar1 = uVar3;
  }
  if ((uVar3 == 0) ||
     (memcpy(&jacobian_tuple_U->Cq,
             (double *)
             ((long)local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x18),(ulong)(uVar1 * 8)), uVar3 < 3)) {
    uVar2 = (ulong)(uVar1 << 3);
    memcpy((void *)((long)(jacobian_tuple_U->Cq).
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data.array + uVar2),
           (void *)((long)local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + uVar2 + 0x18),0x18 - uVar2);
  }
  uVar3 = -((uint)((ulong)&jacobian_tuple_V->Cq >> 3) & 0x1fffffff) & 7;
  uVar1 = 3;
  if (uVar3 < 3) {
    uVar1 = uVar3;
  }
  if ((uVar3 != 0) &&
     (memcpy(&jacobian_tuple_V->Cq,
             (double *)
             ((long)local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x30),(ulong)(uVar1 * 8)), 2 < uVar3)) {
    return;
  }
  uVar2 = (ulong)(uVar1 << 3);
  memcpy((void *)((long)(jacobian_tuple_V->Cq).
                        super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                        m_data.array + uVar2),
         (void *)((long)local_88.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + uVar2 + 0x30),0x18 - uVar2);
  return;
}

Assistant:

void ChNodeSPH::ComputeJacobianForContactPart(const ChVector<>& abs_point,
                                              ChMatrix33<>& contact_plane,
                                              type_constraint_tuple& jacobian_tuple_N,
                                              type_constraint_tuple& jacobian_tuple_U,
                                              type_constraint_tuple& jacobian_tuple_V,
                                              bool second) {
    ChMatrix33<> Jx1 = contact_plane.transpose();
    if (!second)
        Jx1 *= -1;

    jacobian_tuple_N.Get_Cq().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq().segment(0, 3) = Jx1.row(2);
}